

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.h
# Opt level: O0

void __thiscall
haVoc::ScoredMoves::ScoredMoves
          (ScoredMoves *this,position *p,Movegen *m,vector<Move,_std::allocator<Move>_> *filters,
          Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc *score_lambda,
          Score cutoff)

{
  Move *followup_00;
  Move *previous_00;
  Move *filters_00;
  vector<Move,_std::allocator<Move>_> *moves;
  Movegen *p_00;
  function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
  local_60;
  Move *local_40;
  Move *followup_local;
  Move *previous_local;
  vector<Move,_std::allocator<Move>_> *filters_local;
  Movegen *m_local;
  position *p_local;
  ScoredMoves *this_local;
  
  local_40 = followup;
  followup_local = previous;
  previous_local = (Move *)filters;
  filters_local = (vector<Move,_std::allocator<Move>_> *)m;
  m_local = (Movegen *)p;
  p_local = (position *)this;
  std::vector<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>::vector(&this->m_moves);
  this->m_start = 0;
  this->m_end = 0;
  std::vector<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>::clear(&this->m_moves);
  p_00 = m_local;
  moves = filters_local;
  filters_00 = previous_local;
  previous_00 = followup_local;
  followup_00 = local_40;
  std::
  function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
  ::function(&local_60,score_lambda);
  load_and_score(this,(position *)p_00,(Movegen *)moves,
                 (vector<Move,_std::allocator<Move>_> *)filters_00,previous_00,followup_00,threat,
                 stack,&local_60);
  std::
  function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
  ::~function(&local_60);
  sort(this,&cutoff);
  return;
}

Assistant:

ScoredMoves(const position& p, Movegen* m, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda, Score cutoff) {
			m_moves.clear();
			load_and_score(p, m, filters, previous, followup, threat, stack, score_lambda);
			sort(cutoff);
		}